

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

void __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<(anonymous_namespace)::CMakeVersion>::Object
          (Object<(anonymous_namespace)::CMakeVersion> *this,
          Object<(anonymous_namespace)::CMakeVersion> *param_1)

{
  undefined3 uVar1;
  ReadFileResult RVar2;
  Object<(anonymous_namespace)::CMakeVersion> *param_1_local;
  Object<(anonymous_namespace)::CMakeVersion> *this_local;
  
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ::vector(&this->Members,&param_1->Members);
  uVar1 = *(undefined3 *)&param_1->field_0x19;
  RVar2 = param_1->Success;
  this->AnyRequired = param_1->AnyRequired;
  *(undefined3 *)&this->field_0x19 = uVar1;
  this->Success = RVar2;
  this->Fail = param_1->Fail;
  this->AllowExtra = param_1->AllowExtra;
  return;
}

Assistant:

Object(E&& success, E&& fail, bool allowExtra = true)
      : Success(std::move(success))
      , Fail(std::move(fail))
      , AllowExtra(allowExtra)
    {
    }